

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O3

void sam_hdr_free(SAM_hdr *hdr)

{
  char *__ptr;
  kh_sam_hdr_t *__ptr_00;
  kh_m_s2i_t *pkVar1;
  void *pvVar2;
  int iVar3;
  SAM_SQ *__ptr_01;
  SAM_RG *__ptr_02;
  SAM_PG *__ptr_03;
  long lVar4;
  long lVar5;
  
  if ((hdr != (SAM_hdr *)0x0) && (iVar3 = hdr->ref_count, hdr->ref_count = iVar3 + -1, iVar3 < 2)) {
    __ptr = (hdr->text).s;
    if (__ptr != (char *)0x0) {
      free(__ptr);
    }
    __ptr_00 = hdr->h;
    if (__ptr_00 != (kh_sam_hdr_t *)0x0) {
      free(__ptr_00->keys);
      free(__ptr_00->flags);
      free(__ptr_00->vals);
      free(__ptr_00);
    }
    pkVar1 = hdr->ref_hash;
    if (pkVar1 != (kh_m_s2i_t *)0x0) {
      free(pkVar1->keys);
      free(pkVar1->flags);
      free(pkVar1->vals);
      free(pkVar1);
    }
    __ptr_01 = hdr->ref;
    if (__ptr_01 != (SAM_SQ *)0x0) {
      iVar3 = hdr->nref;
      if (0 < iVar3) {
        lVar4 = 0;
        lVar5 = 0;
        do {
          pvVar2 = *(void **)((long)&hdr->ref->name + lVar4);
          if (pvVar2 != (void *)0x0) {
            free(pvVar2);
            iVar3 = hdr->nref;
          }
          lVar5 = lVar5 + 1;
          lVar4 = lVar4 + 0x20;
        } while (lVar5 < iVar3);
        __ptr_01 = hdr->ref;
      }
      free(__ptr_01);
    }
    pkVar1 = hdr->rg_hash;
    if (pkVar1 != (kh_m_s2i_t *)0x0) {
      free(pkVar1->keys);
      free(pkVar1->flags);
      free(pkVar1->vals);
      free(pkVar1);
    }
    __ptr_02 = hdr->rg;
    if (__ptr_02 != (SAM_RG *)0x0) {
      iVar3 = hdr->nrg;
      if (0 < iVar3) {
        lVar4 = 0;
        lVar5 = 0;
        do {
          pvVar2 = *(void **)((long)&hdr->rg->name + lVar4);
          if (pvVar2 != (void *)0x0) {
            free(pvVar2);
            iVar3 = hdr->nrg;
          }
          lVar5 = lVar5 + 1;
          lVar4 = lVar4 + 0x20;
        } while (lVar5 < iVar3);
        __ptr_02 = hdr->rg;
      }
      free(__ptr_02);
    }
    pkVar1 = hdr->pg_hash;
    if (pkVar1 != (kh_m_s2i_t *)0x0) {
      free(pkVar1->keys);
      free(pkVar1->flags);
      free(pkVar1->vals);
      free(pkVar1);
    }
    __ptr_03 = hdr->pg;
    if (__ptr_03 != (SAM_PG *)0x0) {
      iVar3 = hdr->npg;
      if (0 < iVar3) {
        lVar4 = 0;
        lVar5 = 0;
        do {
          pvVar2 = *(void **)((long)&hdr->pg->name + lVar4);
          if (pvVar2 != (void *)0x0) {
            free(pvVar2);
            iVar3 = hdr->npg;
          }
          lVar5 = lVar5 + 1;
          lVar4 = lVar4 + 0x28;
        } while (lVar5 < iVar3);
        __ptr_03 = hdr->pg;
      }
      free(__ptr_03);
    }
    if (hdr->pg_end != (int *)0x0) {
      free(hdr->pg_end);
    }
    if (hdr->type_pool != (pool_alloc_t *)0x0) {
      pool_destroy(hdr->type_pool);
    }
    if (hdr->tag_pool != (pool_alloc_t *)0x0) {
      pool_destroy(hdr->tag_pool);
    }
    if (hdr->str_pool != (string_alloc_t *)0x0) {
      string_pool_destroy(hdr->str_pool);
    }
    free(hdr);
    return;
  }
  return;
}

Assistant:

void sam_hdr_free(SAM_hdr *hdr) {
    if (!hdr)
	return;

    if (--hdr->ref_count > 0)
	return;

    if (ks_str(&hdr->text))
	KS_FREE(&hdr->text);

    if (hdr->h)
	kh_destroy(sam_hdr, hdr->h);

    if (hdr->ref_hash)
	kh_destroy(m_s2i, hdr->ref_hash);

    if (hdr->ref) {
	int i;
	for (i = 0; i < hdr->nref; i++)
	    if (hdr->ref[i].name)
		free(hdr->ref[i].name);
	free(hdr->ref);
    }

    if (hdr->rg_hash)
	kh_destroy(m_s2i, hdr->rg_hash);

    if (hdr->rg) {
	int i;
	for (i = 0; i < hdr->nrg; i++)
	    if (hdr->rg[i].name)
		free(hdr->rg[i].name);
	free(hdr->rg);
    }

    if (hdr->pg_hash)
	kh_destroy(m_s2i, hdr->pg_hash);

    if (hdr->pg) {
	int i;
	for (i = 0; i < hdr->npg; i++)
	    if (hdr->pg[i].name)
		free(hdr->pg[i].name);
	free(hdr->pg);
    }

    if (hdr->pg_end)
	free(hdr->pg_end);

    if (hdr->type_pool)
	pool_destroy(hdr->type_pool);

    if (hdr->tag_pool)
	pool_destroy(hdr->tag_pool);

    if (hdr->str_pool)
	string_pool_destroy(hdr->str_pool);

    free(hdr);
}